

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

void __thiscall
icu_63::DayPeriodRulesDataSink::addCutoff
          (DayPeriodRulesDataSink *this,CutoffType type,UnicodeString *hour_str,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t hour;
  UErrorCode *errorCode_local;
  UnicodeString *hour_str_local;
  CutoffType type_local;
  DayPeriodRulesDataSink *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (type == CUTOFF_TYPE_UNKNOWN) {
      *errorCode = U_INVALID_FORMAT_ERROR;
    }
    else {
      iVar2 = parseHour(hour_str,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        this->cutoffs[iVar2] = 1 << ((byte)type & 0x1f) | this->cutoffs[iVar2];
      }
    }
  }
  return;
}

Assistant:

void addCutoff(CutoffType type, const UnicodeString &hour_str, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return; }

        if (type == CUTOFF_TYPE_UNKNOWN) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }

        int32_t hour = parseHour(hour_str, errorCode);
        if (U_FAILURE(errorCode)) { return; }

        cutoffs[hour] |= 1 << type;
    }